

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O2

unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>
helics::make_filter(FilterTypes type,Core *core,string_view name)

{
  Core *extraout_RDX;
  Core *extraout_RDX_00;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *dfilt;
  undefined4 in_register_0000003c;
  __uniq_ptr_data<helics::Filter,_std::default_delete<helics::Filter>,_true,_true> __args;
  char *in_R8;
  Core *core_local;
  string_view name_local;
  Filter *local_20;
  
  __args.super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
  super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
  super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl._4_4_ = in_register_0000003c;
  __args.super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
  super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
  super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl._0_4_ = type;
  name_local._M_len = (size_t)name._M_str;
  core_local = (Core *)name._M_len;
  if ((FilterTypes)core == CLONE) {
    name_local._M_str = in_R8;
    std::
    make_unique<helics::CloningFilter,helics::Core*&,std::basic_string_view<char,std::char_traits<char>>&>
              ((Core **)&local_20,(basic_string_view<char,_std::char_traits<char>_> *)&core_local);
    *(Filter **)
     __args.super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
     super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
     super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl = local_20;
    addOperations(local_20,CLONE,extraout_RDX);
    (**(code **)(**(long **)__args.
                            super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>
                            .super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl + 0x30))
              (*(long **)__args.
                         super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>
                         .super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl,8,"delivery",
               name_local._M_len,name_local._M_str);
  }
  else {
    std::
    make_unique<helics::Filter,helics::Core*&,std::basic_string_view<char,std::char_traits<char>>&>
              ((Core **)__args.
                        super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>
                        .super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl,
               (basic_string_view<char,_std::char_traits<char>_> *)&core_local);
    addOperations(*(Filter **)
                   __args.
                   super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
                   super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
                   super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl,(FilterTypes)core,
                  extraout_RDX_00);
  }
  return (__uniq_ptr_data<helics::Filter,_std::default_delete<helics::Filter>,_true,_true>)
         (tuple<helics::Filter_*,_std::default_delete<helics::Filter>_>)
         __args.super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
         super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
         super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Filter> make_filter(FilterTypes type, Core* core, std::string_view name)
{
    if (type == FilterTypes::CLONE) {
        std::unique_ptr<Filter> dfilt = std::make_unique<CloningFilter>(core, name);
        addOperations(dfilt.get(), type, core);
        dfilt->setString("delivery", name);
        return dfilt;
    }
    auto dfilt = std::make_unique<Filter>(core, name);
    addOperations(dfilt.get(), type, core);
    return dfilt;
}